

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

MeanVarianceNormalizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_mvn(NeuralNetworkLayer *this)

{
  MeanVarianceNormalizeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0xa5) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xa5;
    this_00 = (MeanVarianceNormalizeLayerParams *)operator_new(0x20);
    MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams(this_00);
    (this->layer_).mvn_ = this_00;
  }
  return (MeanVarianceNormalizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MeanVarianceNormalizeLayerParams* NeuralNetworkLayer::mutable_mvn() {
  if (!has_mvn()) {
    clear_layer();
    set_has_mvn();
    layer_.mvn_ = new ::CoreML::Specification::MeanVarianceNormalizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.mvn)
  return layer_.mvn_;
}